

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O0

CommEnum BootLine(void)

{
  int iVar1;
  char *LineStr;
  char *local_10;
  CommEnum local_4;
  
  local_10 = ReadInput();
  while (local_10 == (char *)0x0) {
    Idle();
    local_10 = ReadInput();
  }
  iVar1 = strcmp(local_10,"ucci");
  if (iVar1 == 0) {
    local_4 = e_CommUcci;
  }
  else {
    local_4 = e_CommNone;
  }
  return local_4;
}

Assistant:

CommEnum BootLine(void) {
    const char *LineStr;
    LineStr = ReadInput();
    while (LineStr == NULL) {
        Idle();
        LineStr = ReadInput();
    }
    if (strcmp(LineStr, "ucci") == 0) {
        return e_CommUcci;
    } else {
        return e_CommNone;
    }
}